

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::checkDependencies(CommonCore *this)

{
  BaseTimeCoordinator *pBVar1;
  BaseType *pBVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  GlobalFederateId dest;
  GlobalFederateId *dep;
  BaseType *pBVar8;
  GlobalFederateId dest_00;
  ulong uVar9;
  undefined1 local_1d8 [16];
  GlobalFederateId local_1c8;
  InterfaceHandle IStack_1c4;
  ushort local_1be;
  ActionMessage rmdep;
  iterator local_60;
  iterator local_48;
  
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            (&local_48,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_60,&(this->loopFederates).dataStorage);
  local_1d8._0_8_ = local_48.vec;
  local_1d8._8_8_ = local_48.ptr;
  local_1c8.gid = local_48.offset;
  IStack_1c4.hid = local_48._20_4_;
  bVar5 = false;
  bVar6 = false;
  while ((uVar3 = local_1d8._8_8_, local_1c8.gid != local_60.offset ||
         ((FedInfo **)local_1d8._0_8_ != local_60.vec))) {
    iVar7 = FederateState::endpointCount(*(FederateState **)local_1d8._8_8_);
    if (0 < iVar7) {
      bVar4 = FederateState::getOptionFlag(*(FederateState **)uVar3,0);
      if (bVar4) {
        pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar1->_vptr_BaseTimeCoordinator[6])
                  (pBVar1,(ulong)(uint)((*(FederateState **)uVar3)->global_id)._M_i.gid);
        ActionMessage::ActionMessage(&rmdep,cmd_remove_dependent);
        rmdep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        rmdep.dest_id.gid = ((*(FederateState **)uVar3)->global_id)._M_i.gid;
        FederateState::addAction(*(FederateState **)uVar3,&rmdep);
        ActionMessage::~ActionMessage(&rmdep);
        bVar5 = true;
      }
      else {
        bVar4 = FederateState::getOptionFlag(*(FederateState **)uVar3,4);
        if (bVar4) {
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[7])
                    (pBVar1,(ulong)(uint)((*(FederateState **)uVar3)->global_id)._M_i.gid);
          ActionMessage::ActionMessage(&rmdep,cmd_remove_dependency);
          rmdep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          rmdep.dest_id.gid = ((*(FederateState **)uVar3)->global_id)._M_i.gid;
          FederateState::addAction(*(FederateState **)uVar3,&rmdep);
          ActionMessage::~ActionMessage(&rmdep);
          bVar6 = true;
        }
      }
    }
    gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++
              ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)local_1d8);
  }
  BaseTimeCoordinator::getDependents
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)&rmdep,
             (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  uVar9 = CONCAT44(rmdep.source_handle.hid,rmdep.source_id.gid) - rmdep._0_8_;
  std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
  ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                )&rmdep);
  if (uVar9 < 9) {
    BaseTimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)&rmdep
               ,(this->super_BrokerBase).timeCoord._M_t.
                super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar9 = CONCAT44(rmdep.source_handle.hid,rmdep.source_id.gid) - rmdep._0_8_;
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   *)&rmdep);
    if (uVar9 < 9) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &rmdep,(this->super_BrokerBase).timeCoord._M_t.
                        super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      pBVar2 = (BaseType *)CONCAT44(rmdep.source_handle.hid,rmdep.source_id.gid);
      iVar7 = 0;
      dest_00.gid = -2010000000;
      dest.gid = -2010000000;
      for (pBVar8 = (BaseType *)rmdep._0_8_; pBVar8 != pBVar2; pBVar8 = pBVar8 + 1) {
        bVar4 = isLocal(this,(GlobalFederateId)*pBVar8);
        if (bVar4) {
          iVar7 = iVar7 + 1;
          dest.gid = *pBVar8;
        }
        else {
          dest_00.gid = *pBVar8;
        }
      }
      std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
      ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                     *)&rmdep);
      if (iVar7 < 2) {
        if ((iVar7 == 0) && ((dest_00.gid == -1700000000 || (dest_00.gid == -2010000000)))) {
          (this->super_BrokerBase).hasTimeDependency = false;
        }
        else {
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &rmdep,(this->super_BrokerBase).timeCoord._M_t.
                            super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                            .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>.
                            _M_head_impl);
          do {
            if ((int *)rmdep._0_8_ == (int *)CONCAT44(rmdep.source_handle.hid,rmdep.source_id.gid))
            {
              std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
              ::~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                               *)&rmdep);
              pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
              (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest_00.gid);
              pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
              (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest.gid);
              pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
              (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest_00.gid);
              pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
              (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest.gid);
              (this->super_BrokerBase).hasTimeDependency = false;
              ActionMessage::ActionMessage(&rmdep,cmd_remove_interdependency);
              rmdep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
              routeMessage(this,&rmdep,dest_00);
              routeMessage(this,&rmdep,dest);
              local_1d8._8_4_ = dest.gid;
              if (bVar5) {
                ActionMessage::ActionMessage((ActionMessage *)local_1d8,cmd_add_dependent);
                local_1be = local_1be | 0x4000;
                routeMessage(this,(ActionMessage *)local_1d8,dest_00);
                ActionMessage::setAction((ActionMessage *)local_1d8,cmd_add_dependency);
                local_1d8._8_4_ = dest_00.gid;
                local_1be = local_1be & 0x9fff | 0x2000;
                routeMessage(this,(ActionMessage *)local_1d8,dest);
              }
              else if (bVar6) {
                ActionMessage::ActionMessage((ActionMessage *)local_1d8,cmd_add_dependency);
                local_1be = local_1be | 0x4000;
                routeMessage(this,(ActionMessage *)local_1d8,dest_00);
                ActionMessage::setAction((ActionMessage *)local_1d8,cmd_add_dependent);
                local_1be = local_1be & 0x9fff | 0x2000;
                local_1d8._8_4_ = dest_00.gid;
                routeMessage(this,(ActionMessage *)local_1d8,dest);
              }
              else {
                ActionMessage::ActionMessage((ActionMessage *)local_1d8,cmd_add_interdependency);
                local_1be = local_1be | 0x4000;
                routeMessage(this,(ActionMessage *)local_1d8,dest_00);
                routeMessage(this,(ActionMessage *)local_1d8,dest);
                local_1d8._8_4_ = dest_00.gid;
                local_1be = local_1be & 0x9fff | 0x2000;
                routeMessage(this,(ActionMessage *)local_1d8,dest);
              }
              ActionMessage::~ActionMessage((ActionMessage *)local_1d8);
              ActionMessage::~ActionMessage(&rmdep);
              return;
            }
            iVar7 = *(int *)rmdep._0_8_;
            rmdep._0_8_ = rmdep._0_8_ + 4;
          } while (iVar7 == dest_00.gid || iVar7 == dest.gid);
          std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
          ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         *)&rmdep);
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::checkDependencies()
{
    bool isobs = false;
    bool issource = false;
    auto checkdep = [this, &isobs, &issource](auto& fed) {
        if (fed->endpointCount() > 0) {
            if (fed->getOptionFlag(defs::Flags::OBSERVER)) {
                timeCoord->removeDependency(fed->global_id);
                ActionMessage rmdep(CMD_REMOVE_DEPENDENT);

                rmdep.source_id = global_broker_id_local;
                rmdep.dest_id = fed->global_id.load();
                fed->addAction(rmdep);
                isobs = true;
            } else if (fed->getOptionFlag(defs::Flags::SOURCE_ONLY)) {
                timeCoord->removeDependent(fed->global_id);
                ActionMessage rmdep(CMD_REMOVE_DEPENDENCY);

                rmdep.source_id = global_broker_id_local;
                rmdep.dest_id = fed->global_id.load();
                fed->addAction(rmdep);
                issource = true;
            }
        }
    };
    loopFederates.apply(checkdep);

    // if there is more than 2 dependents or dependencies (higher broker + 2 or more federates)
    // then we need to be a timeCoordinator
    if (timeCoord->getDependents().size() > 2) {
        return;
    }
    if (timeCoord->getDependencies().size() > 2) {
        return;
    }
    GlobalFederateId fedid;
    GlobalBrokerId brkid;
    int localcnt = 0;
    for (const auto& dep : timeCoord->getDependents()) {
        if (isLocal(dep)) {
            ++localcnt;
            fedid = dep;
        } else {
            brkid = static_cast<GlobalBrokerId>(dep);
        }
    }
    if (localcnt > 1) {
        return;
    }
    if ((localcnt == 0) && (!brkid.isValid())) {
        hasTimeDependency = false;
        return;
    }
    // check to make sure the dependencies match
    for (auto& dep : timeCoord->getDependencies()) {
        if (!((dep == fedid) || (dep == brkid))) {
            return;
        }
    }
    // remove the core from the time dependency chain since it is just adding to the
    // communication noise in this case
    timeCoord->removeDependency(brkid);
    timeCoord->removeDependency(fedid);
    timeCoord->removeDependent(brkid);
    timeCoord->removeDependent(fedid);
    hasTimeDependency = false;
    ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);

    rmdep.source_id = global_broker_id_local;
    routeMessage(rmdep, brkid);
    routeMessage(rmdep, fedid);
    if (isobs) {
        ActionMessage adddep(CMD_ADD_DEPENDENT);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);
        adddep.setAction(CMD_ADD_DEPENDENCY);
        adddep.source_id = brkid;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    } else if (issource) {
        ActionMessage adddep(CMD_ADD_DEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);

        adddep.setAction(CMD_ADD_DEPENDENT);
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        adddep.source_id = brkid;
        routeMessage(adddep, fedid);
    } else {
        ActionMessage adddep(CMD_ADD_INTERDEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, brkid);
        // make sure the fed depends on itself in case the broker removes itself later
        routeMessage(adddep, fedid);
        adddep.source_id = brkid;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    }
}